

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O2

void finish_example_scores<false>(vw *all,oaa *o,example *ec)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  namedlabels *this;
  int *piVar4;
  _func_void_int_string_v_array<char> *p_Var5;
  v_array<char> vVar6;
  ostream *poVar7;
  ulong uVar8;
  uint32_t pred;
  ulong uVar9;
  int *piVar10;
  v_array<char> *pvVar11;
  uint uVar12;
  float fVar13;
  substring sVar14;
  undefined8 in_stack_fffffffffffffde8;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [22];
  char temp_str [10];
  string local_1c8 [32];
  ostringstream outputStringStream;
  
  pfVar3 = (ec->pred).scalars._begin;
  uVar9 = 0;
  uVar8 = 1;
  while( true ) {
    if (o->k <= uVar8) break;
    fVar13 = pfVar3[uVar8];
    pfVar1 = pfVar3 + uVar9;
    uVar12 = (uint)uVar8;
    if (fVar13 < *pfVar1 || fVar13 == *pfVar1) {
      uVar12 = (uint)uVar9;
    }
    uVar8 = (ulong)((uint)uVar8 + 1);
    uVar9 = (ulong)uVar12;
  }
  pred = (uint)uVar9 + 1;
  fVar13 = 0.0;
  if ((ec->l).multi.label != pred) {
    fVar13 = ec->weight;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputStringStream);
  for (uVar12 = 0; uVar8 = (ulong)uVar12, uVar8 < o->k; uVar12 = uVar12 + 1) {
    if (uVar8 != 0) {
      std::operator<<((ostream *)&outputStringStream,' ');
    }
    this = all->sd->ldict;
    if (this == (namedlabels *)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&outputStringStream);
    }
    else {
      sVar14 = namedlabels::get(this,uVar12 + 1);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,sVar14.begin,sVar14.end);
      std::operator<<((ostream *)&outputStringStream,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
    }
    sprintf(temp_str,"%f",SUB84((double)(ec->pred).scalars._begin[uVar8],0));
    poVar7 = std::operator<<((ostream *)&outputStringStream,':');
    std::operator<<(poVar7,temp_str);
  }
  piVar4 = (all->final_prediction_sink)._end;
  pvVar11 = &ec->tag;
  for (piVar10 = (all->final_prediction_sink)._begin; piVar10 != piVar4; piVar10 = piVar10 + 1) {
    iVar2 = *piVar10;
    p_Var5 = all->print_text;
    std::__cxx11::stringbuf::str();
    vVar6._end = (char *)all;
    vVar6._begin = (char *)in_stack_fffffffffffffde8;
    vVar6.end_array._0_4_ = fVar13;
    vVar6.end_array._4_4_ = pred;
    vVar6.erase_count = (size_t)ec;
    (*p_Var5)(iVar2,(string)*pvVar11,vVar6);
    std::__cxx11::string::~string(local_1c8);
  }
  shared_data::update(all->sd,ec->test_only,(ec->l).multi.label != 0xffffffff,fVar13,ec->weight,
                      ec->num_features);
  MULTICLASS::print_update_with_score(all,ec,pred);
  VW::finish_example(all,ec);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputStringStream);
  return;
}

Assistant:

void finish_example_scores(vw& all, oaa& o, example& ec)
{
  // === Compute multiclass_log_loss
  // TODO:
  // What to do if the correct label is unknown, i.e. (uint32_t)-1?
  //   Suggestion: increase all.sd->weighted_unlabeled_examples???,
  //               but not sd.example_number, so the average loss is not influenced.
  // What to do if the correct_class_prob==0?
  //   Suggestion: have some maximal multiclass_log_loss limit, e.g. 999.
  float multiclass_log_loss = 999;  // -log(0) = plus infinity
  float correct_class_prob = 0;
  if (probabilities)
  {
    if (ec.l.multi.label <= o.k)  // prevent segmentation fault if labeĺ==(uint32_t)-1
      correct_class_prob = ec.pred.scalars[ec.l.multi.label - 1];
    if (correct_class_prob > 0)
      multiclass_log_loss = -log(correct_class_prob) * ec.weight;
    if (ec.test_only)
      all.sd->holdout_multiclass_log_loss += multiclass_log_loss;
    else
      all.sd->multiclass_log_loss += multiclass_log_loss;
  }
  // === Compute `prediction` and zero_one_loss
  // We have already computed `prediction` in predict_or_learn,
  // but we cannot store it in ec.pred union because we store ec.pred.probs there.
  uint32_t prediction = 0;
  for (uint32_t i = 1; i < o.k; i++)
    if (ec.pred.scalars[i] > ec.pred.scalars[prediction])
      prediction = i;
  prediction++;  // prediction is 1-based index (not 0-based)
  float zero_one_loss = 0;
  if (ec.l.multi.label != prediction)
    zero_one_loss = ec.weight;

  // === Print probabilities for all classes
  char temp_str[10];
  ostringstream outputStringStream;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (i > 0)
      outputStringStream << ' ';
    if (all.sd->ldict)
    {
      substring ss = all.sd->ldict->get(i + 1);
      outputStringStream << string(ss.begin, ss.end - ss.begin);
    }
    else
      outputStringStream << i + 1;
    sprintf(temp_str, "%f", ec.pred.scalars[i]);  // 0.123 -> 0.123000
    outputStringStream << ':' << temp_str;
  }
  for (int sink : all.final_prediction_sink) all.print_text(sink, outputStringStream.str(), ec.tag);

  // === Report updates using zero-one loss
  all.sd->update(ec.test_only, ec.l.multi.label != (uint32_t)-1, zero_one_loss, ec.weight, ec.num_features);
  // Alternatively, we could report multiclass_log_loss.
  // all.sd->update(ec.test_only, multiclass_log_loss, ec.weight, ec.num_features);
  // Even better would be to report both losses, but this would mean to increase
  // the number of columns and this would not fit narrow screens.
  // So let's report (average) multiclass_log_loss only in the final resume.

  // === Print progress report
  if (probabilities)
    MULTICLASS::print_update_with_probability(all, ec, prediction);
  else
    MULTICLASS::print_update_with_score(all, ec, prediction);
  VW::finish_example(all, ec);
}